

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
* __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::CreateShaders
          (map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
           *__return_storage_ptr__,ExplicitUniformLocationCaseBase *this,
          vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
          *programConfigs,
          vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          *uniforms,
          vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          *subroutineUniforms,string *additionalDef)

{
  undefined4 uVar1;
  ulong uVar2;
  size_t sVar3;
  string *additionalDef_00;
  string *subroutineUniforms_00;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  *uniforms_00;
  bool bVar4;
  ContextType type;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  RenderContext *pRVar8;
  mapped_type *pmVar9;
  pointer ppVar10;
  _Self local_b8;
  _Self local_b0;
  iterator i;
  char *cSource [1];
  undefined1 local_98 [8];
  string source;
  iterator iStack_70;
  GLuint shader;
  _Self local_58;
  ulong local_50;
  size_t target;
  size_t config;
  string *local_38;
  string *additionalDef_local;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  *subroutineUniforms_local;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  *uniforms_local;
  vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  *programConfigs_local;
  ExplicitUniformLocationCaseBase *this_local;
  map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
  *ret;
  
  config._7_1_ = 0;
  local_38 = additionalDef;
  additionalDef_local = (string *)subroutineUniforms;
  subroutineUniforms_local =
       (vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
        *)uniforms;
  uniforms_local =
       (vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
        *)programConfigs;
  programConfigs_local =
       (vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
        *)this;
  this_local = (ExplicitUniformLocationCaseBase *)__return_storage_ptr__;
  std::
  map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
  ::map(__return_storage_ptr__);
  for (target = 0; sVar3 = target,
      sVar5 = std::
              vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
              ::size((vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                      *)uniforms_local), sVar3 < sVar5; target = target + 1) {
    local_50 = 0;
    while( true ) {
      uVar2 = local_50;
      pvVar6 = std::
               vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
               ::operator[]((vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                             *)uniforms_local,target);
      sVar5 = std::
              vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
              ::size(pvVar6);
      if (sVar5 <= uVar2) break;
      pvVar6 = std::
               vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
               ::operator[]((vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                             *)uniforms_local,target);
      pvVar7 = std::
               vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
               ::operator[](pvVar6,local_50);
      local_58._M_node =
           (_Base_ptr)
           std::
           map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
           ::find(__return_storage_ptr__,pvVar7);
      iStack_70 = std::
                  map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                  ::end(__return_storage_ptr__);
      bVar4 = std::operator==(&local_58,&stack0xffffffffffffff90);
      if (bVar4) {
        pvVar6 = std::
                 vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                 ::operator[]((vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                               *)uniforms_local,target);
        pvVar7 = std::
                 vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                 ::operator[](pvVar6,local_50);
        source.field_2._12_4_ =
             glu::CallLogWrapper::glCreateShader
                       (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
                        pvVar7->stage);
        pvVar6 = std::
                 vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                 ::operator[]((vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                               *)uniforms_local,target);
        pvVar7 = std::
                 vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                 ::operator[](pvVar6,local_50);
        uniforms_00 = subroutineUniforms_local;
        subroutineUniforms_00 = additionalDef_local;
        additionalDef_00 = local_38;
        pRVar8 = deqp::Context::getRenderContext
                           ((this->super_SubcaseBase).super_GLWrapper.m_context);
        type.super_ApiType.m_bits = (ApiType)(*pRVar8->_vptr_RenderContext[2])();
        ShaderSourceFactory::generateShader
                  ((string *)local_98,pvVar7,
                   (vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                    *)uniforms_00,
                   (vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                    *)subroutineUniforms_00,additionalDef_00,type);
        i._M_node = (_Base_ptr)std::__cxx11::string::c_str();
        glu::CallLogWrapper::glShaderSource
                  (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
                   source.field_2._12_4_,1,(GLchar **)&i,(GLint *)0x0);
        uVar1 = source.field_2._12_4_;
        pvVar6 = std::
                 vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                 ::operator[]((vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                               *)uniforms_local,target);
        pvVar7 = std::
                 vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                 ::operator[](pvVar6,local_50);
        pmVar9 = std::
                 map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                 ::operator[](__return_storage_ptr__,pvVar7);
        *pmVar9 = uVar1;
        std::__cxx11::string::~string((string *)local_98);
      }
      local_50 = local_50 + 1;
    }
  }
  local_b0._M_node =
       (_Base_ptr)
       std::
       map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
       ::begin(__return_storage_ptr__);
  while( true ) {
    local_b8._M_node =
         (_Base_ptr)
         std::
         map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
         ::end(__return_storage_ptr__);
    bVar4 = std::operator!=(&local_b0,&local_b8);
    if (!bVar4) break;
    ppVar10 = std::
              _Rb_tree_iterator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>
              ::operator->(&local_b0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,ppVar10->second);
    std::_Rb_tree_iterator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>
    ::operator++(&local_b0,0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<ShaderKey, GLuint> CreateShaders(const std::vector<std::vector<ShaderKey> >& programConfigs,
											  const std::vector<Uniform>&			uniforms,
											  const std::vector<SubroutineUniform>& subroutineUniforms,
											  const std::string&					additionalDef)
	{
		std::map<ShaderKey, GLuint> ret;

		//create shaders
		for (size_t config = 0; config < programConfigs.size(); config++)
		{
			for (size_t target = 0; target < programConfigs[config].size(); target++)
			{

				if (ret.find(programConfigs[config][target]) == ret.end())
				{
					GLuint shader = glCreateShader(programConfigs[config][target].stage);

					std::string source = ShaderSourceFactory::generateShader(programConfigs[config][target], uniforms,
																			 subroutineUniforms, additionalDef,
																			 m_context.getRenderContext().getType());
					const char* cSource[] = { source.c_str() };
					glShaderSource(shader, 1, cSource, NULL);
					ret[programConfigs[config][target]] = shader;
				}
			}
		}

		//compile shaders
		for (std::map<ShaderKey, GLuint>::iterator i = ret.begin(); i != ret.end(); i++)
		{
			glCompileShader(i->second);
		}

		return ret;
	}